

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O0

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,ArithmeticalExpression *expression)

{
  bool bVar1;
  Value *pVVar2;
  VariableValue *pVVar3;
  PrimitiveSimpleObject *pPVar4;
  Type *pTVar5;
  allocator<char> local_81;
  string local_80;
  int local_60;
  int local_5c;
  int result;
  int rhs_1;
  int lhs;
  int local_1c;
  ArithmeticalExpression *pAStack_18;
  int rhs;
  ArithmeticalExpression *expression_local;
  NewFunctionProcessingVisitor *this_local;
  
  pAStack_18 = expression;
  expression_local = (ArithmeticalExpression *)this;
  if (expression->lhs_ == (Expression *)0x0) {
    pVVar2 = TemplateVisitor<Value_*>::Accept
                       (&this->super_TemplateVisitor<Value_*>,&expression->rhs_->super_Node);
    local_1c = (*pVVar2->_vptr_Value[2])();
    pVVar3 = (VariableValue *)operator_new(0x50);
    rhs_1._0_1_ = 1;
    pPVar4 = (PrimitiveSimpleObject *)operator_new(0x18);
    rhs_1._1_1_ = 1;
    pTVar5 = (Type *)operator_new(0x28);
    rhs_1._2_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&lhs,"int",(allocator<char> *)((long)&rhs_1 + 3));
    Type::Type(pTVar5,(string *)&lhs);
    rhs_1._2_1_ = 0;
    PrimitiveSimpleObject::PrimitiveSimpleObject(pPVar4,pTVar5);
    rhs_1._1_1_ = 0;
    VariableValue::VariableValue(pVVar3,pPVar4,-local_1c);
    rhs_1._0_1_ = 0;
    (this->super_TemplateVisitor<Value_*>).tos_value_ = (Value *)pVVar3;
    std::__cxx11::string::~string((string *)&lhs);
    std::allocator<char>::~allocator((allocator<char> *)((long)&rhs_1 + 3));
  }
  else {
    pVVar2 = TemplateVisitor<Value_*>::Accept
                       (&this->super_TemplateVisitor<Value_*>,&expression->lhs_->super_Node);
    result = (*pVVar2->_vptr_Value[2])();
    pVVar2 = TemplateVisitor<Value_*>::Accept
                       (&this->super_TemplateVisitor<Value_*>,&pAStack_18->rhs_->super_Node);
    local_5c = (*pVVar2->_vptr_Value[2])();
    local_60 = 0;
    bVar1 = std::operator==(&pAStack_18->operation_,"+");
    if (bVar1) {
      local_60 = result + local_5c;
    }
    bVar1 = std::operator==(&pAStack_18->operation_,"-");
    if (bVar1) {
      local_60 = result - local_5c;
    }
    bVar1 = std::operator==(&pAStack_18->operation_,"*");
    if (bVar1) {
      local_60 = result * local_5c;
    }
    bVar1 = std::operator==(&pAStack_18->operation_,"/");
    if (bVar1) {
      local_60 = result / local_5c;
    }
    bVar1 = std::operator==(&pAStack_18->operation_,"%");
    if (bVar1) {
      local_60 = result % local_5c;
    }
    pVVar3 = (VariableValue *)operator_new(0x50);
    pPVar4 = (PrimitiveSimpleObject *)operator_new(0x18);
    pTVar5 = (Type *)operator_new(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"int",&local_81);
    Type::Type(pTVar5,&local_80);
    PrimitiveSimpleObject::PrimitiveSimpleObject(pPVar4,pTVar5);
    VariableValue::VariableValue(pVVar3,pPVar4,local_60);
    (this->super_TemplateVisitor<Value_*>).tos_value_ = (Value *)pVVar3;
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(ArithmeticalExpression* expression) {
  if (expression->lhs_ == nullptr) {
    auto rhs = Accept(expression->rhs_)->GetValue();

    tos_value_ =
        new VariableValue(new PrimitiveSimpleObject(new Type("int")), -rhs);
  } else {
    auto lhs = Accept(expression->lhs_)->GetValue();
    auto rhs = Accept(expression->rhs_)->GetValue();
    int result = 0;

    if (expression->operation_ == "+") {
      result = lhs + rhs;
    }
    if (expression->operation_ == "-") {
      result = lhs - rhs;
    }
    if (expression->operation_ == "*") {
      result = lhs * rhs;
    }
    if (expression->operation_ == "/") {
      result = lhs / rhs;
    }
    if (expression->operation_ == "%") {
      result = lhs % rhs;
    }

    tos_value_ =
        new VariableValue(new PrimitiveSimpleObject(new Type("int")), result);
  }
}